

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O3

int MPLSParser::calcPlayItemID(MPLSStreamInfo *streamInfo,uint32_t pts)

{
  pointer pmVar1;
  pointer pmVar2;
  ulong uVar3;
  size_t *psVar4;
  ulong uVar5;
  
  pmVar1 = (streamInfo->super_M2TSStreamInfo).m_index.
           super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pmVar2 = (streamInfo->super_M2TSStreamInfo).m_index.
           super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = ((long)pmVar2 - (long)pmVar1 >> 4) * -0x5555555555555555;
  if (pmVar2 != pmVar1) {
    psVar4 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    uVar5 = 0;
    do {
      if ((*psVar4 != 0) && ((ulong)pts < *(ulong *)((_Base_ptr)psVar4[-2] + 1))) {
        uVar3 = 1;
        if (1 < (int)uVar5) {
          uVar3 = uVar5 & 0xffffffff;
        }
        break;
      }
      uVar5 = uVar5 + 1;
      psVar4 = psVar4 + 6;
    } while (uVar3 + (uVar3 == 0) != uVar5);
  }
  return (int)uVar3 + -1;
}

Assistant:

int MPLSParser::calcPlayItemID(const MPLSStreamInfo& streamInfo, const uint32_t pts)
{
    for (size_t i = 0; i < streamInfo.m_index.size(); i++)
    {
        if (!streamInfo.m_index[i].empty())
        {
            if (streamInfo.m_index[i].begin()->first > pts)
                return FFMAX((int)i, 1) - 1;
        }
    }
    return static_cast<int>(streamInfo.m_index.size()) - 1;
}